

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdPlugin.c
# Opt level: O3

int Abc_ManReadStatus(char *pFileName,char *pToken)

{
  char *__haystack;
  int iVar1;
  Vec_Str_t *__ptr;
  char *pcVar2;
  
  __ptr = Abc_ManReadFile(pFileName);
  if (__ptr == (Vec_Str_t *)0x0) {
    iVar1 = -1;
  }
  else {
    __haystack = __ptr->pArray;
    pcVar2 = strstr(__haystack,pToken);
    if (pcVar2 == (char *)0x0) {
      iVar1 = -1;
    }
    else {
      iVar1 = strncmp(pcVar2 + 8,"proved",6);
      if (iVar1 == 0) {
        iVar1 = 1;
      }
      else {
        iVar1 = strncmp(pcVar2 + 8,"failed",6);
        iVar1 = -(uint)(iVar1 != 0);
      }
    }
    if (__haystack != (char *)0x0) {
      free(__haystack);
    }
    free(__ptr);
  }
  return iVar1;
}

Assistant:

int Abc_ManReadStatus( char * pFileName, char * pToken )
{
    int Result = -1;
    Vec_Str_t * vStr;
    char * pStr;
    vStr = Abc_ManReadFile( pFileName );
    if ( vStr == NULL )
        return -1;
    pStr = Vec_StrArray( vStr );
    pStr = strstr( pStr, pToken );
    if ( pStr != NULL )
    {
        if ( strncmp(pStr+8, "proved", 6) == 0 )
            Result = 1; 
        else if ( strncmp(pStr+8, "failed", 6) == 0 )
            Result = 0; 
    }
    Vec_StrFree( vStr );
    return Result;
}